

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O0

void WriteExponent(int K,char *buffer)

{
  char *pcVar1;
  char *d_1;
  char *d;
  char *buffer_local;
  int K_local;
  
  d = buffer;
  buffer_local._4_4_ = K;
  if (K < 0) {
    d = buffer + 1;
    *buffer = '-';
    buffer_local._4_4_ = -K;
  }
  if (buffer_local._4_4_ < 100) {
    if (buffer_local._4_4_ < 10) {
      *d = (char)buffer_local._4_4_ + '0';
      d = d + 1;
    }
    else {
      pcVar1 = GetDigitsLut();
      *d = pcVar1[buffer_local._4_4_ << 1];
      d[1] = (pcVar1 + (buffer_local._4_4_ << 1))[1];
      d = d + 2;
    }
  }
  else {
    *d = (char)(buffer_local._4_4_ / 100) + '0';
    pcVar1 = GetDigitsLut();
    d[1] = pcVar1[buffer_local._4_4_ % 100 << 1];
    d[2] = (pcVar1 + (buffer_local._4_4_ % 100 << 1))[1];
    d = d + 3;
  }
  *d = '\0';
  return;
}

Assistant:

inline void WriteExponent(int K, char* buffer) {
	if (K < 0) {
		*buffer++ = '-';
		K = -K;
	}

	if (K >= 100) {
		*buffer++ = '0' + static_cast<char>(K / 100);
		K %= 100;
		const char* d = GetDigitsLut() + K * 2;
		*buffer++ = d[0];
		*buffer++ = d[1];
	}
	else if (K >= 10) {
		const char* d = GetDigitsLut() + K * 2;
		*buffer++ = d[0];
		*buffer++ = d[1];
	}
	else
		*buffer++ = '0' + static_cast<char>(K);

	*buffer = '\0';
}